

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O0

void __thiscall
CoreML::NeuralNetworkShaper::shapeDotLayer(NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  undefined8 uVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  *this_00;
  string *psVar2;
  mapped_type *this_01;
  mapped_type *pmVar3;
  ShapeRange *pSVar4;
  ShapeRange *pSVar5;
  ShapeRange local_178;
  ShapeRange local_158;
  ShapeRange local_138;
  ShapeRange local_118;
  undefined1 local_e8 [8];
  ShapeConstraint outputShape;
  ShapeConstraint *inputShape2;
  ShapeConstraint *inputShape1;
  NeuralNetworkLayer *specLayer_local;
  NeuralNetworkShaper *this_local;
  
  this_00 = &this->blobShapes;
  psVar2 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,0);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](this_00,psVar2);
  psVar2 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,1);
  outputShape._name.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
       ::operator[](this_00,psVar2);
  psVar2 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](this_00,psVar2);
  ShapeConstraint::ShapeConstraint((ShapeConstraint *)local_e8,pmVar3);
  psVar2 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  ShapeConstraint::setName((ShapeConstraint *)local_e8,psVar2);
  pSVar4 = ShapeConstraint::sequenceRange((ShapeConstraint *)local_e8);
  pSVar5 = ShapeConstraint::sequenceRange(this_01);
  ShapeRange::intersect(&local_118,pSVar4,pSVar5);
  ShapeConstraint::updateSequenceRange((ShapeConstraint *)local_e8,&local_118);
  pSVar4 = ShapeConstraint::batchRange((ShapeConstraint *)local_e8);
  pSVar5 = ShapeConstraint::batchRange(this_01);
  ShapeRange::intersect(&local_138,pSVar4,pSVar5);
  ShapeConstraint::updateBatchRange((ShapeConstraint *)local_e8,&local_138);
  pSVar4 = ShapeConstraint::sequenceRange((ShapeConstraint *)local_e8);
  pSVar5 = ShapeConstraint::sequenceRange((ShapeConstraint *)outputShape._name.field_2._8_8_);
  ShapeRange::intersect(&local_158,pSVar4,pSVar5);
  ShapeConstraint::updateSequenceRange((ShapeConstraint *)local_e8,&local_158);
  pSVar4 = ShapeConstraint::batchRange((ShapeConstraint *)local_e8);
  pSVar5 = ShapeConstraint::batchRange((ShapeConstraint *)outputShape._name.field_2._8_8_);
  ShapeRange::intersect(&local_178,pSVar4,pSVar5);
  ShapeConstraint::updateBatchRange((ShapeConstraint *)local_e8,&local_178);
  ShapeConstraint::setHeight(this_01,1);
  ShapeConstraint::setWidth(this_01,1);
  ShapeConstraint::setHeight((ShapeConstraint *)outputShape._name.field_2._8_8_,1);
  ShapeConstraint::setWidth((ShapeConstraint *)outputShape._name.field_2._8_8_,1);
  ShapeConstraint::copyFrom(this_01,(ShapeConstraint *)outputShape._name.field_2._8_8_);
  ShapeConstraint::copyFrom((ShapeConstraint *)outputShape._name.field_2._8_8_,this_01);
  pSVar4 = ShapeConstraint::sequenceRange((ShapeConstraint *)local_e8);
  ShapeConstraint::updateSequenceRange(this_01,pSVar4);
  pSVar4 = ShapeConstraint::batchRange((ShapeConstraint *)local_e8);
  ShapeConstraint::updateBatchRange(this_01,pSVar4);
  uVar1 = outputShape._name.field_2._8_8_;
  pSVar4 = ShapeConstraint::sequenceRange((ShapeConstraint *)local_e8);
  ShapeConstraint::updateSequenceRange((ShapeConstraint *)uVar1,pSVar4);
  uVar1 = outputShape._name.field_2._8_8_;
  pSVar4 = ShapeConstraint::batchRange((ShapeConstraint *)local_e8);
  ShapeConstraint::updateBatchRange((ShapeConstraint *)uVar1,pSVar4);
  ShapeConstraint::setChannel((ShapeConstraint *)local_e8,1);
  ShapeConstraint::setHeight((ShapeConstraint *)local_e8,1);
  ShapeConstraint::setWidth((ShapeConstraint *)local_e8,1);
  ShapeConstraint::~ShapeConstraint((ShapeConstraint *)local_e8);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeDotLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape1 = blobShapes[specLayer.input(0)];
    ShapeConstraint& inputShape2 = blobShapes[specLayer.input(1)];
    ShapeConstraint outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));
#if COREML_VALIDATOR_VERBOSE
    std::cout << "Dot layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape1;
    std::cout << inputShape2;
    std::cout << "Dot layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(inputShape1.sequenceRange()));
    outputShape.updateBatchRange(outputShape.batchRange().intersect(inputShape1.batchRange()));
    outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(inputShape2.sequenceRange()));
    outputShape.updateBatchRange(outputShape.batchRange().intersect(inputShape2.batchRange()));

    inputShape1.setHeight(1);
    inputShape1.setWidth(1);
    inputShape2.setHeight(1);
    inputShape2.setWidth(1);

    // The inputs need to be equal
    inputShape1.copyFrom(inputShape2);
    inputShape2.copyFrom(inputShape1);

    inputShape1.updateSequenceRange(outputShape.sequenceRange());
    inputShape1.updateBatchRange(outputShape.batchRange());

    inputShape2.updateSequenceRange(outputShape.sequenceRange());
    inputShape2.updateBatchRange(outputShape.batchRange());

    outputShape.setChannel(1);
    outputShape.setHeight(1);
    outputShape.setWidth(1);

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Dot layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape1;
    std::cout << inputShape2;
    std::cout << "Dot layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif


}